

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

bool __thiscall QIconModeViewBase::filterDragMoveEvent(QIconModeViewBase *this,QDragMoveEvent *e)

{
  QDragMoveEvent QVar1;
  QWidget *pQVar2;
  QListViewPrivate *pQVar3;
  QSize QVar4;
  QAbstractItemModel *pQVar5;
  bool bVar6;
  bool bVar7;
  LayoutDirection LVar8;
  int iVar9;
  QListView *pQVar10;
  QPoint QVar11;
  qsizetype qVar12;
  ulong uVar13;
  Representation RVar14;
  undefined8 uVar15;
  long in_FS_OFFSET;
  double dVar16;
  double dVar17;
  QRect QVar18;
  undefined1 local_88 [16];
  QPoint local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = e[0xc];
  e[0xc] = (QDragMoveEvent)0x0;
  pQVar10 = (QListView *)QDropEvent::source();
  if (pQVar10 == (this->super_QCommonListViewBase).qq) {
    bVar7 = QAbstractItemViewPrivate::canDrop
                      (&((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate,
                       (QDropEvent *)e);
    if (bVar7) {
      QVar18 = itemsRect(this,&this->draggedItems);
      pQVar2 = (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
               super_QAbstractScrollAreaPrivate.viewport;
      QVar11 = draggedItemsDelta(this);
      local_50.r = QVar11.xp.m_i.m_i + QVar18.x1.m_i.m_i;
      local_50.c = QVar11.yp.m_i.m_i + QVar18.y1.m_i.m_i;
      local_50.i = CONCAT44(QVar11.yp.m_i.m_i + QVar18.y2.m_i.m_i,
                            QVar11.xp.m_i.m_i + QVar18.x2.m_i.m_i);
      QWidget::update(pQVar2,(QRect *)&local_50);
      dVar17 = (double)((ulong)*(double *)(e + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
               *(double *)(e + 0x10);
      bVar7 = 2147483647.0 < dVar17;
      if (dVar17 <= -2147483648.0) {
        dVar17 = -2147483648.0;
      }
      QVar11.xp.m_i =
           (int)(double)(-(ulong)bVar7 & 0x41dfffffffc00000 | ~-(ulong)bVar7 & (ulong)dVar17);
      dVar17 = (double)((ulong)*(double *)(e + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
               *(double *)(e + 0x18);
      bVar7 = 2147483647.0 < dVar17;
      if (dVar17 <= -2147483648.0) {
        dVar17 = -2147483648.0;
      }
      QVar11.yp.m_i =
           (int)(double)(-(ulong)bVar7 & 0x41dfffffffc00000 | ~-(ulong)bVar7 & (ulong)dVar17);
      this->draggedItemsPos = QVar11;
      pQVar2 = (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
               super_QAbstractScrollAreaPrivate.viewport;
      QVar11 = draggedItemsDelta(this);
      local_50.r = QVar11.xp.m_i.m_i + QVar18.x1.m_i.m_i;
      local_50.c = QVar18.y1.m_i.m_i + QVar11.yp.m_i.m_i;
      local_50.i = CONCAT44(QVar11.yp.m_i.m_i + QVar18.y2.m_i.m_i,
                            QVar11.xp.m_i.m_i + QVar18.x2.m_i.m_i);
      QWidget::update(pQVar2,(QRect *)&local_50);
      local_50.r = -1;
      local_50.c = -1;
      local_50.i = 0;
      local_50.m.ptr = (QAbstractItemModel *)0x0;
      pQVar3 = (this->super_QCommonListViewBase).dd;
      if (pQVar3->movement == Snap) {
        dVar17 = (double)((ulong)*(double *)(e + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
                 *(double *)(e + 0x10);
        bVar7 = 2147483647.0 < dVar17;
        if (dVar17 <= -2147483648.0) {
          dVar17 = -2147483648.0;
        }
        dVar16 = (double)((ulong)*(double *)(e + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
                 *(double *)(e + 0x18);
        bVar6 = 2147483647.0 < dVar16;
        if (dVar16 <= -2147483648.0) {
          dVar16 = -2147483648.0;
        }
        pQVar2 = *(QWidget **)
                  &(pQVar3->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                   super_QFramePrivate.super_QWidgetPrivate.field_0x8;
        LVar8 = QWidget::layoutDirection(pQVar2);
        iVar9 = (**(code **)(*(long *)pQVar2 + 0x2b0))(pQVar2);
        local_60 = -iVar9;
        if (LVar8 != RightToLeft) {
          local_60 = iVar9;
        }
        local_5c = (**(code **)(*(long *)pQVar2 + 0x2b8))(pQVar2);
        local_60 = local_60 +
                   (int)(double)(-(ulong)bVar7 & 0x41dfffffffc00000 | ~-(ulong)bVar7 & (ulong)dVar17
                                );
        local_5c = local_5c +
                   (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar16
                                );
        QVar4 = ((this->super_QCommonListViewBase).dd)->grid;
        RVar14 = QVar4.wd.m_i;
        local_60 = local_60 - local_60 % RVar14.m_i;
        local_58 = RVar14.m_i + local_60 + -1;
        RVar14 = QVar4.ht.m_i;
        local_5c = local_5c - local_5c % RVar14.m_i;
        local_54 = RVar14.m_i + -1 + local_5c;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[7])(&local_78,this);
        if (local_68 == (undefined1 *)0x0) {
          local_88 = (undefined1  [16])0x0;
          local_50._0_8_ = -1;
        }
        else {
          local_50._0_8_ = *(undefined8 *)(puStack_70 + (long)local_68 * 0x18 + -0x18);
          local_88 = *(undefined1 (*) [16])(puStack_70 + (long)local_68 * 0x18 + -0x10);
        }
        local_50.i = local_88._0_8_;
        local_50.m.ptr = (QAbstractItemModel *)local_88._8_8_;
        if (local_78 != (QPoint)0x0) {
          LOCK();
          *(int *)local_78 = *(int *)local_78 + -1;
          UNLOCK();
          if (*(int *)local_78 == 0) {
            QArrayData::deallocate((QArrayData *)local_78,0x18,0x10);
          }
        }
      }
      else {
        dVar17 = (double)((ulong)*(double *)(e + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
                 *(double *)(e + 0x10);
        bVar7 = 2147483647.0 < dVar17;
        if (dVar17 <= -2147483648.0) {
          dVar17 = -2147483648.0;
        }
        local_78.xp.m_i =
             (int)(double)(-(ulong)bVar7 & 0x41dfffffffc00000 | ~-(ulong)bVar7 & (ulong)dVar17);
        dVar17 = (double)((ulong)*(double *)(e + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
                 *(double *)(e + 0x18);
        bVar7 = 2147483647.0 < dVar17;
        if (dVar17 <= -2147483648.0) {
          dVar17 = -2147483648.0;
        }
        local_78.yp.m_i =
             (int)(double)(-(ulong)bVar7 & 0x41dfffffffc00000 | ~-(ulong)bVar7 & (ulong)dVar17);
        (**(code **)(*(long *)&(((this->super_QCommonListViewBase).qq)->super_QAbstractItemView).
                               super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1f0))
                  (&local_50);
      }
      qVar12 = QtPrivate::indexOf<QModelIndex,QModelIndex>(&this->draggedItems,&local_50,0);
      if (qVar12 == -1) {
        pQVar5 = (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).model;
        uVar13 = (**(code **)(*(long *)pQVar5 + 0x138))(pQVar5,&local_50);
        if (((((uVar13 & 8) != 0) || (local_50.r < 0)) || ((long)local_50._0_8_ < 0)) ||
           (local_50.m.ptr == (QAbstractItemModel *)0x0)) goto LAB_00572fe8;
      }
      else {
LAB_00572fe8:
        e[0xc] = (QDragMoveEvent)0x1;
      }
      dVar17 = (double)((ulong)*(double *)(e + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
               *(double *)(e + 0x10);
      bVar7 = 2147483647.0 < dVar17;
      if (dVar17 <= -2147483648.0) {
        dVar17 = -2147483648.0;
      }
      local_78.xp.m_i =
           (int)(double)(-(ulong)bVar7 & 0x41dfffffffc00000 | ~-(ulong)bVar7 & (ulong)dVar17);
      dVar17 = (double)((ulong)*(double *)(e + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
               *(double *)(e + 0x18);
      bVar7 = 2147483647.0 < dVar17;
      if (dVar17 <= -2147483648.0) {
        dVar17 = -2147483648.0;
      }
      local_78.yp.m_i =
           (int)(double)(-(ulong)bVar7 & 0x41dfffffffc00000 | ~-(ulong)bVar7 & (ulong)dVar17);
      bVar7 = QAbstractItemViewPrivate::shouldAutoScroll
                        (&((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate,
                         &local_78);
      if (bVar7) {
        pQVar3 = (this->super_QCommonListViewBase).dd;
        uVar15 = 50000000;
        if ((pQVar3->super_QAbstractItemViewPrivate).verticalScrollMode == ScrollPerItem) {
          uVar15 = 150000000;
        }
        QBasicTimer::start(&(pQVar3->super_QAbstractItemViewPrivate).autoScrollTimer,uVar15,1,
                           *(undefined8 *)
                            &(pQVar3->super_QAbstractItemViewPrivate).
                             super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                             super_QWidgetPrivate.field_0x8);
        (pQVar3->super_QAbstractItemViewPrivate).autoScrollCount = 0;
      }
      bVar7 = true;
      goto LAB_00572e84;
    }
  }
  (**(code **)(*(long *)e + 0x10))(e,QVar1);
  bVar7 = false;
LAB_00572e84:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QIconModeViewBase::filterDragMoveEvent(QDragMoveEvent *e)
{
    const bool wasAccepted = e->isAccepted();

    // ignore by default
    e->ignore();

    if (e->source() != qq || !dd->canDrop(e)) {
        // restore previous acceptance on failure
        e->setAccepted(wasAccepted);
        return false;
    }

    // get old dragged items rect
    QRect itemsRect = this->itemsRect(draggedItems);
    viewport()->update(itemsRect.translated(draggedItemsDelta()));
    // update position
    draggedItemsPos = e->position().toPoint();
    // get new items rect
    viewport()->update(itemsRect.translated(draggedItemsDelta()));
    // set the item under the cursor to current
    QModelIndex index;
    if (movement() == QListView::Snap) {
        QRect rect(snapToGrid(e->position().toPoint() + offset()), gridSize());
        const QList<QModelIndex> intersectVector = intersectingSet(rect);
        index = intersectVector.size() > 0 ? intersectVector.last() : QModelIndex();
    } else {
        index = qq->indexAt(e->position().toPoint());
    }
    // check if we allow drops here
    if (draggedItems.contains(index))
        e->accept(); // allow changing item position
    else if (dd->model->flags(index) & Qt::ItemIsDropEnabled)
        e->accept(); // allow dropping on dropenabled items
    else if (!index.isValid())
        e->accept(); // allow dropping in empty areas

    // the event was treated. do autoscrolling
    if (dd->shouldAutoScroll(e->position().toPoint()))
        dd->startAutoScroll();
    return true;
}